

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O3

void duckdb::MapConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pVVar1;
  pointer pVVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  undefined8 uVar6;
  element_type *peVar7;
  bool bVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  reference pvVar11;
  reference pvVar12;
  __normal_iterator<duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
  _Var13;
  long lVar14;
  ulong uVar15;
  size_type *psVar16;
  size_type *psVar17;
  idx_t iVar18;
  Vector *pVVar19;
  ulong uVar20;
  Value *list_entry;
  size_type sVar21;
  long lVar22;
  size_type *psVar23;
  Value *insert;
  size_type __n;
  size_type *psVar24;
  ulong uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  vector<duckdb::Value,_true> keys_list;
  vector<duckdb::Value,_true> values_list;
  vector<duckdb::UnifiedVectorFormat,_true> map_formats;
  vector<duckdb::Value,_true> list_entries;
  size_type *local_160;
  long local_148;
  Value *pVStack_140;
  undefined8 local_138;
  idx_t local_130;
  Vector *local_128;
  idx_t local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  size_type *local_100;
  data_ptr_t local_f8;
  pointer local_f0;
  pointer local_e8;
  size_type local_e0;
  long local_d8;
  long local_d0;
  Vector *local_c8;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_c0;
  Value local_a8;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  long local_48;
  Value *pVStack_40;
  undefined8 local_38;
  
  if ((result->type).id_ == SQLNULL) {
    FlatVector::VerifyFlatVector(result);
    _Var10._M_head_impl =
         (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (_Var10._M_head_impl == (unsigned_long *)0x0) {
      local_c0.
      super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_a8,(unsigned_long *)&local_c0);
      peVar7 = local_a8.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = local_a8.type_._0_8_;
      local_a8.type_._0_8_ = (Value *)0x0;
      local_a8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (Value *)local_a8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (Value *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data);
      _Var10._M_head_impl =
           (pTVar9->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var10._M_head_impl;
    }
    *(byte *)_Var10._M_head_impl = (byte)*_Var10._M_head_impl & 0xfe;
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  else {
    local_130 = args->count;
    pVVar1 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = ((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
              (&local_c0,__n,(allocator_type *)&local_a8);
    local_f0 = pVVar2;
    local_e8 = pVVar1;
    if (pVVar2 != pVVar1) {
      sVar21 = 0;
      do {
        pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar21);
        pvVar12 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,sVar21);
        Vector::ToUnifiedFormat(pvVar11,local_130,pvVar12);
        sVar21 = sVar21 + 1;
      } while (__n + (__n == 0) != sVar21);
    }
    if (local_130 != 0) {
      local_f8 = result->data;
      local_e0 = __n + (__n == 0);
      iVar18 = 0;
      local_128 = result;
      do {
        local_148 = 0;
        pVStack_140 = (Value *)0x0;
        local_138 = 0;
        local_120 = iVar18;
        if (local_f0 == local_e8) {
          bVar8 = true;
          local_160 = (size_type *)0x0;
          psVar24 = (size_type *)0x0;
        }
        else {
          bVar8 = true;
          sVar21 = 0;
          psVar24 = (size_type *)0x0;
          local_160 = (size_type *)0x0;
          local_100 = (size_type *)0x0;
          do {
            pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar21);
            if ((pvVar11->type).id_ != SQLNULL) {
              pvVar12 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                  ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_c0,sVar21);
              psVar3 = pvVar12->sel->sel_vector;
              iVar18 = local_120;
              if (psVar3 != (sel_t *)0x0) {
                iVar18 = (idx_t)psVar3[local_120];
              }
              puVar4 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if ((puVar4 == (unsigned_long *)0x0) ||
                 ((puVar4[iVar18 >> 6] >> (iVar18 & 0x3f) & 1) != 0)) {
                pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar21);
                local_c8 = MapVector::GetKeys(pvVar11);
                local_d0 = *(long *)(pvVar12->data + iVar18 * 0x10 + 8);
                if (local_d0 != 0) {
                  local_d8 = *(long *)(pvVar12->data + iVar18 * 0x10);
                  lVar22 = 0;
                  do {
                    iVar18 = lVar22 + local_d8;
                    Vector::GetValue(&local_a8,local_c8,iVar18);
                    _Var13 = ::std::
                             __find_if<__gnu_cxx::__normal_iterator<duckdb::Value*,std::vector<duckdb::Value,std::allocator<duckdb::Value>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::Value_const>>
                                       (local_148,pVStack_140,&local_a8);
                    if (_Var13._M_current == pVStack_140) {
                      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_148
                                 ,&local_a8);
                      if (local_160 == local_100) {
                        lVar14 = (long)local_160 - (long)psVar24;
                        if (lVar14 == 0x7ffffffffffffff0) {
                          ::std::__throw_length_error("vector::_M_realloc_insert");
                        }
                        uVar15 = lVar14 >> 4;
                        uVar20 = uVar15;
                        if (local_160 == psVar24) {
                          uVar20 = 1;
                        }
                        uVar25 = uVar20 + uVar15;
                        if (0x7fffffffffffffe < uVar25) {
                          uVar25 = 0x7ffffffffffffff;
                        }
                        if (CARRY8(uVar20,uVar15)) {
                          uVar25 = 0x7ffffffffffffff;
                        }
                        psVar16 = (size_type *)operator_new(uVar25 * 0x10);
                        *(size_type *)((long)psVar16 + lVar14) = sVar21;
                        *(idx_t *)((long)psVar16 + lVar14 + 8) = iVar18;
                        psVar23 = psVar16;
                        for (psVar17 = psVar24; local_160 != psVar17; psVar17 = psVar17 + 2) {
                          sVar5 = psVar17[1];
                          *psVar23 = *psVar17;
                          psVar23[1] = sVar5;
                          psVar23 = psVar23 + 2;
                        }
                        if (psVar24 != (size_type *)0x0) {
                          operator_delete(psVar24);
                        }
                        local_160 = psVar23 + 2;
                        local_100 = psVar16 + uVar25 * 2;
                        psVar24 = psVar16;
                      }
                      else {
                        *local_160 = sVar21;
                        local_160[1] = iVar18;
                        local_160 = local_160 + 2;
                      }
                    }
                    else {
                      lVar14 = (long)_Var13._M_current - local_148 >> 2;
                      *(idx_t *)((long)psVar24 + lVar14 + 8) = iVar18;
                      *(size_type *)((long)psVar24 + lVar14) = sVar21;
                    }
                    Value::~Value(&local_a8);
                    lVar22 = lVar22 + 1;
                  } while (lVar22 != local_d0);
                }
                bVar8 = false;
              }
            }
            sVar21 = sVar21 + 1;
          } while (sVar21 != local_e0);
        }
        iVar18 = ListVector::GetListSize(local_128);
        *(idx_t *)(local_f8 + local_120 * 0x10) = iVar18;
        *(long *)((long)(local_f8 + local_120 * 0x10) + 8) = (long)pVStack_140 - local_148 >> 6;
        if (bVar8) {
          FlatVector::SetNull(local_128,local_120,true);
        }
        else {
          uVar26 = 0;
          uVar27 = 0;
          uVar28 = 0;
          uVar29 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          psVar23 = psVar24;
          if (psVar24 == local_160) {
            local_58 = 0;
          }
          else {
            do {
              pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,*psVar23);
              pVVar19 = MapVector::GetValues(pvVar11);
              Vector::GetValue(&local_a8,pVVar19,psVar23[1]);
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
              emplace_back<duckdb::Value>
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118,
                         &local_a8);
              Value::~Value(&local_a8);
              psVar23 = psVar23 + 2;
            } while (psVar23 != local_160);
            local_58 = local_108;
            uVar26 = (undefined4)local_118;
            uVar27 = local_118._4_4_;
            uVar28 = (undefined4)uStack_110;
            uVar29 = uStack_110._4_4_;
          }
          local_48 = local_148;
          pVStack_40 = pVStack_140;
          local_38 = local_138;
          local_148 = 0;
          pVStack_140 = (Value *)0x0;
          local_138 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          local_68 = uVar26;
          uStack_64 = uVar27;
          uStack_60 = uVar28;
          uStack_5c = uVar29;
          GetListEntries((vector<duckdb::Value,_true> *)&local_a8,
                         (vector<duckdb::Value,_true> *)&local_48,
                         (vector<duckdb::Value,_true> *)&local_68);
          pVVar19 = local_128;
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
          peVar7 = local_a8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          for (insert = (Value *)local_a8.type_._0_8_; insert != (Value *)peVar7;
              insert = insert + 1) {
            ListVector::PushBack(pVVar19,insert);
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118);
        }
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_148);
        if (psVar24 != (size_type *)0x0) {
          operator_delete(psVar24);
        }
        iVar18 = local_120 + 1;
        result = local_128;
      } while (iVar18 != local_130);
    }
    bVar8 = DataChunk::AllConstant(args);
    if (bVar8) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    Vector::Verify(result,local_130);
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
    ~vector(&local_c0);
  }
  return;
}

Assistant:

static void MapConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (result.GetType().id() == LogicalTypeId::SQLNULL) {
		// All inputs are NULL, just return NULL
		auto &validity = FlatVector::Validity(result);
		validity.SetInvalid(0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return;
	}
	D_ASSERT(result.GetType().id() == LogicalTypeId::MAP);
	auto count = args.size();

	auto map_count = args.ColumnCount();
	vector<UnifiedVectorFormat> map_formats(map_count);
	for (idx_t i = 0; i < map_count; i++) {
		auto &map = args.data[i];
		map.ToUnifiedFormat(count, map_formats[i]);
	}
	auto result_data = FlatVector::GetData<list_entry_t>(result);

	for (idx_t i = 0; i < count; i++) {
		// Loop through all the maps per list
		// we cant do better because all the entries of the child vector have to be contiguous
		// so we cant start the next row before we have finished the one before it
		auto &result_entry = result_data[i];
		vector<MapKeyIndexPair> index_to_map;
		vector<Value> keys_list;
		bool all_null = true;
		for (idx_t map_idx = 0; map_idx < map_count; map_idx++) {
			if (args.data[map_idx].GetType().id() == LogicalTypeId::SQLNULL) {
				continue;
			}

			auto &map_format = map_formats[map_idx];
			auto index = map_format.sel->get_index(i);
			if (!map_format.validity.RowIsValid(index)) {
				continue;
			}

			all_null = false;
			auto &keys = MapVector::GetKeys(args.data[map_idx]);
			auto entry = UnifiedVectorFormat::GetData<list_entry_t>(map_format)[index];

			// Update the list for this row
			for (idx_t list_idx = 0; list_idx < entry.length; list_idx++) {
				auto key_index = entry.offset + list_idx;
				auto key = keys.GetValue(key_index);
				auto entry = std::find(keys_list.begin(), keys_list.end(), key);
				if (entry == keys_list.end()) {
					// Result list does not contain this value yet
					keys_list.push_back(key);
					index_to_map.emplace_back(map_idx, key_index);
				} else {
					// Result list already contains this, update where to find the value at
					auto distance = std::distance(keys_list.begin(), entry);
					auto &mapping = *(index_to_map.begin() + distance);
					mapping.key_index = key_index;
					mapping.map_index = map_idx;
				}
			}
		}

		result_entry.offset = ListVector::GetListSize(result);
		result_entry.length = keys_list.size();
		if (all_null) {
			D_ASSERT(keys_list.empty() && index_to_map.empty());
			FlatVector::SetNull(result, i, true);
			continue;
		}

		vector<Value> values_list;
		D_ASSERT(keys_list.size() == index_to_map.size());
		// Get the values from the mapping
		for (auto &mapping : index_to_map) {
			auto &map = args.data[mapping.map_index];
			auto &values = MapVector::GetValues(map);
			values_list.push_back(values.GetValue(mapping.key_index));
		}
		D_ASSERT(values_list.size() == keys_list.size());
		auto list_entries = GetListEntries(std::move(keys_list), std::move(values_list));
		for (auto &list_entry : list_entries) {
			ListVector::PushBack(result, list_entry);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}